

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

void cleanup_player_timed(void)

{
  timed_grade *p;
  timed_failure *ptVar1;
  timed_grade *ptVar2;
  timed_failure *p_00;
  size_t i;
  long lVar3;
  
  lVar3 = 0;
  do {
    p = timed_effects[lVar3].grade;
    p_00 = timed_effects[lVar3].fail;
    while (p_00 != (timed_failure *)0x0) {
      ptVar1 = p_00->next;
      mem_free(p_00);
      p_00 = ptVar1;
    }
    timed_effects[lVar3].fail = (timed_failure *)0x0;
    while (p != (timed_grade *)0x0) {
      ptVar2 = p->next;
      string_free(p->name);
      string_free(p->up_msg);
      string_free(p->down_msg);
      mem_free(p);
      p = ptVar2;
    }
    timed_effects[lVar3].grade = (timed_grade *)0x0;
    string_free(timed_effects[lVar3].desc);
    timed_effects[lVar3].desc = (char *)0x0;
    string_free(timed_effects[lVar3].on_end);
    timed_effects[lVar3].on_end = (char *)0x0;
    string_free(timed_effects[lVar3].on_increase);
    timed_effects[lVar3].on_increase = (char *)0x0;
    string_free(timed_effects[lVar3].on_decrease);
    timed_effects[lVar3].on_decrease = (char *)0x0;
    timed_effects[lVar3].msgt = 0;
    free_effect(timed_effects[lVar3].on_begin_effect);
    timed_effects[lVar3].on_begin_effect = (effect *)0x0;
    free_effect(timed_effects[lVar3].on_end_effect);
    timed_effects[lVar3].on_end_effect = (effect *)0x0;
    timed_effects[lVar3].flags = '\0';
    timed_effects[lVar3].lower_bound = 0;
    timed_effects[lVar3].oflag_dup = 0;
    timed_effects[lVar3].oflag_syn = false;
    timed_effects[lVar3].temp_resist = -1;
    timed_effects[lVar3].temp_brand = -1;
    timed_effects[lVar3].temp_slay = -1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x35);
  return;
}

Assistant:

static void cleanup_player_timed(void)
{
	/*
	 * Besides cleaning up any dynamically allocated resources, revert
	 * any fields set during parsing to their default values so the
	 * timed_effects array is back to where it started after its static
	 * initialization.
	 */
	for (size_t i = 0; i < TMD_MAX; i++) {
		struct timed_effect_data *effect = &timed_effects[i];
		struct timed_failure *f = effect->fail;
		struct timed_grade *grade = effect->grade;

		while (f) {
			struct timed_failure *next = f->next;

			mem_free(f);
			f = next;
		}
		effect->fail = NULL;

		while (grade) {
			struct timed_grade *next = grade->next;
			string_free(grade->name);
			string_free(grade->up_msg);
			string_free(grade->down_msg);
			mem_free(grade);
			grade = next;
		}
		effect->grade = NULL;

		string_free(effect->desc);
		effect->desc = NULL;

		string_free(effect->on_end);
		effect->on_end = NULL;
		string_free(effect->on_increase);
		effect->on_increase = NULL;
		string_free(effect->on_decrease);
		effect->on_decrease = NULL;
		effect->msgt = 0;

		free_effect(effect->on_begin_effect);
		effect->on_begin_effect = NULL;
		free_effect(effect->on_end_effect);
		effect->on_end_effect = NULL;

		effect->flags = 0;
		effect->lower_bound = 0;
		effect->oflag_dup = OF_NONE;
		effect->oflag_syn = false;
		effect->temp_resist = -1;
		effect->temp_brand = -1;
		effect->temp_slay = -1;
	}
}